

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::CleanupPendingUnroot(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  DListNodeBase<Memory::Recycler::GuestArenaAllocator> *pDVar3;
  GuestArenaAllocator *pGVar4;
  undefined8 *in_FS_OFFSET;
  GuestArenaAllocator *allocator_1;
  Iterator guestArenaIter_1;
  GuestArenaAllocator *allocator;
  EditingIterator guestArenaIter;
  bool foundPendingDelete;
  Recycler *this_local;
  
  if ((this->hasPendingConcurrentFindRoot & 1U) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1365,"(!this->hasPendingConcurrentFindRoot)",
                       "!this->hasPendingConcurrentFindRoot");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if ((this->hasPendingUnpinnedObject & 1U) != 0) {
    SimpleHashTable<void*,Memory::Recycler::PinRecord,Memory::HeapAllocator,DefaultComparer,true,PrimePolicy>
    ::MapAndRemoveIf<Memory::Recycler::CleanupPendingUnroot()::__0>
              ((SimpleHashTable<void*,Memory::Recycler::PinRecord,Memory::HeapAllocator,DefaultComparer,true,PrimePolicy>
                *)&this->pinnedObjectMap);
    this->hasPendingUnpinnedObject = false;
  }
  if ((this->hasPendingDeleteGuestArena & 1U) == 0) {
    DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::Iterator::Iterator
              ((Iterator *)&allocator_1,&this->guestArenaList);
    while( true ) {
      if (guestArenaIter_1.list ==
          (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                           ,0x66,"(current != nullptr)","current != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
      pGVar4 = allocator_1;
      pDVar3 = DListNodeBase<Memory::Recycler::GuestArenaAllocator>::Next
                         (&(guestArenaIter_1.list)->
                           super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>);
      bVar2 = DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::IsHead
                        ((DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)pGVar4,
                         pDVar3);
      if (bVar2) break;
      guestArenaIter_1.list =
           (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)
           DListNodeBase<Memory::Recycler::GuestArenaAllocator>::Next
                     (&(guestArenaIter_1.list)->
                       super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>);
      pGVar4 = DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)&allocator_1);
      if ((pGVar4->pendingDelete & 1U) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                           ,0x138c,"(!allocator.pendingDelete)","!allocator.pendingDelete");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
    }
  }
  else {
    guestArenaIter.super_Iterator.current._6_1_ = 0;
    DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::EditingIterator::EditingIterator
              ((EditingIterator *)&allocator,&this->guestArenaList);
    while( true ) {
      if (guestArenaIter.super_Iterator.list ==
          (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                           ,0x66,"(current != nullptr)","current != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
      pGVar4 = allocator;
      pDVar3 = DListNodeBase<Memory::Recycler::GuestArenaAllocator>::Next
                         (&(guestArenaIter.super_Iterator.list)->
                           super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>);
      bVar2 = DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::IsHead
                        ((DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)pGVar4,
                         pDVar3);
      if (bVar2) break;
      guestArenaIter.super_Iterator.list =
           (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)
           DListNodeBase<Memory::Recycler::GuestArenaAllocator>::Next
                     (&(guestArenaIter.super_Iterator.list)->
                       super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>);
      guestArenaIter_1.current =
           (NodeBase *)
           DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::Iterator::Data
                     ((Iterator *)&allocator);
      if ((((GuestArenaAllocator *)guestArenaIter_1.current)->pendingDelete & 1U) != 0) {
        ArenaData::SetLockBlockList
                  (&(((GuestArenaAllocator *)guestArenaIter_1.current)->super_ArenaAllocator).
                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                    super_ArenaData,false);
        DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::EditingIterator::
        RemoveCurrent<Memory::HeapAllocator>((EditingIterator *)&allocator,&HeapAllocator::Instance)
        ;
        guestArenaIter.super_Iterator.current._6_1_ = 1;
      }
    }
    guestArenaIter.super_Iterator.list =
         (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0;
    this->hasPendingDeleteGuestArena = false;
    if ((guestArenaIter.super_Iterator.current._6_1_ & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1383,"(foundPendingDelete)","foundPendingDelete");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
  }
  return;
}

Assistant:

void
Recycler::CleanupPendingUnroot()
{
    Assert(!this->hasPendingConcurrentFindRoot);
    if (hasPendingUnpinnedObject)
    {
        pinnedObjectMap.MapAndRemoveIf([](void * obj, PinRecord const &refCount)
        {
#if defined(CHECK_MEMORY_LEAK) || defined(LEAK_REPORT)
#ifdef STACK_BACK_TRACE
            Assert(refCount != 0 || refCount.stackBackTraces == nullptr);
#endif
#endif
            return refCount == 0;
        });
        hasPendingUnpinnedObject = false;
    }

    if (hasPendingDeleteGuestArena)
    {
        DebugOnly(bool foundPendingDelete = false);
        DListBase<GuestArenaAllocator>::EditingIterator guestArenaIter(&guestArenaList);
        while (guestArenaIter.Next())
        {
            GuestArenaAllocator& allocator = guestArenaIter.Data();
            if (allocator.pendingDelete)
            {
                allocator.SetLockBlockList(false);
                guestArenaIter.RemoveCurrent(&HeapAllocator::Instance);
                DebugOnly(foundPendingDelete = true);
            }
        }
        hasPendingDeleteGuestArena = false;
        Assert(foundPendingDelete);
    }
#if DBG
    else
    {
        DListBase<GuestArenaAllocator>::Iterator guestArenaIter(&guestArenaList);
        while (guestArenaIter.Next())
        {
            GuestArenaAllocator& allocator = guestArenaIter.Data();
            Assert(!allocator.pendingDelete);
        }
    }
#endif
}